

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O0

PCF_Property pcf_find_property(PCF_Face face,FT_String *prop)

{
  PCF_Property pPVar1;
  bool bVar2;
  int iVar3;
  int local_30;
  int i;
  FT_Bool found;
  PCF_Property properties;
  FT_String *prop_local;
  PCF_Face face_local;
  
  pPVar1 = face->properties;
  bVar2 = false;
  for (local_30 = 0; local_30 < face->nprops && !bVar2; local_30 = local_30 + 1) {
    iVar3 = strcmp(pPVar1[local_30].name,prop);
    if (iVar3 == 0) {
      bVar2 = true;
    }
  }
  if (bVar2) {
    face_local = (PCF_Face)(pPVar1 + (long)local_30 + -1);
  }
  else {
    face_local = (PCF_Face)0x0;
  }
  return (PCF_Property)face_local;
}

Assistant:

FT_LOCAL_DEF( PCF_Property )
  pcf_find_property( PCF_Face          face,
                     const FT_String*  prop )
  {
    PCF_Property  properties = face->properties;
    FT_Bool       found      = 0;
    int           i;


    for ( i = 0; i < face->nprops && !found; i++ )
    {
      if ( !ft_strcmp( properties[i].name, prop ) )
        found = 1;
    }

    if ( found )
      return properties + i - 1;
    else
      return NULL;
  }